

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

void gravity_function_array_dump(gravity_function_t *f,gravity_value_r r)

{
  gravity_class_t *pgVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  char *__format;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 *paVar5;
  
  if (f->tag != EXEC_TYPE_NATIVE) {
    __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                  ,0x244,"void gravity_function_array_dump(gravity_function_t *, gravity_value_r)");
  }
  if (r.n != 0) {
    paVar5 = &(r.p)->field_1;
    sVar3 = 0;
    do {
      pgVar1 = ((gravity_value_t *)(paVar5 + -1))->isa;
      pcVar4 = (char *)paVar5->p;
      if (((ulong)gravity_class_null ^ (ulong)pgVar1) == 0 &&
          (gravity_object_t *)pcVar4 == (gravity_object_t *)0x0) {
        pcVar4 = "%05zu\tNULL\n";
LAB_0012c948:
        printf(pcVar4,sVar3);
      }
      else {
        if (((ulong)gravity_class_null ^ (ulong)pgVar1) == 0 &&
            (gravity_object_t *)pcVar4 == (gravity_object_t *)0x1) {
          pcVar4 = "%05zu\tUNDEFINED\n";
          goto LAB_0012c948;
        }
        if (pgVar1 == gravity_class_bool) {
          uVar2 = (uint)((gravity_object_t *)pcVar4 != (gravity_object_t *)0x0);
          pcVar4 = "%05zu\tBOOL: %d\n";
LAB_0012ca04:
          printf(pcVar4,sVar3,(ulong)uVar2);
        }
        else {
          if (pgVar1 == gravity_class_int) {
            __format = "%05zu\tINT: %ld\n";
          }
          else {
            if (pgVar1 == gravity_class_float) {
              printf("%05zu\tFLOAT: %g\n",pcVar4,sVar3);
              goto LAB_0012c952;
            }
            if (pgVar1 == gravity_class_function) {
              pcVar4 = ((gravity_object_t *)pcVar4)->identifier;
              if ((gravity_object_t *)pcVar4 == (gravity_object_t *)0x0) {
                pcVar4 = "$anon";
              }
              __format = "%05zu\tFUNC: %s\n";
            }
            else if (pgVar1 == gravity_class_class) {
              pcVar4 = ((gravity_object_t *)pcVar4)->identifier;
              if ((gravity_object_t *)pcVar4 == (gravity_object_t *)0x0) {
                pcVar4 = "$anon";
              }
              __format = "%05zu\tCLASS: %s\n";
            }
            else if (pgVar1 == gravity_class_string) {
              pcVar4 = (char *)((gravity_object_t *)pcVar4)->objclass;
              __format = "%05zu\tSTRING: %s\n";
            }
            else {
              if (pgVar1 != gravity_class_list) {
                if (pgVar1 != gravity_class_map) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                                ,0x284,
                                "void gravity_function_array_dump(gravity_function_t *, gravity_value_r)"
                               );
                }
                uVar2 = gravity_hash_count((gravity_hash_t *)((gravity_object_t *)pcVar4)->objclass)
                ;
                pcVar4 = "%05zu\tMAP: %u items\n";
                goto LAB_0012ca04;
              }
              pcVar4 = (char *)((gravity_object_t *)pcVar4)->objclass;
              __format = "%05zu\tLIST: %zu items\n";
            }
          }
          printf(__format,sVar3,pcVar4);
        }
      }
LAB_0012c952:
      sVar3 = sVar3 + 1;
      paVar5 = paVar5 + 2;
    } while (r.n != sVar3);
  }
  return;
}

Assistant:

static void gravity_function_array_dump (gravity_function_t *f, gravity_value_r r) {
    assert(f->tag == EXEC_TYPE_NATIVE);
    size_t n = marray_size(r);

    for (size_t i=0; i<n; i++) {
        gravity_value_t v = marray_get(r, i);

        if (VALUE_ISA_NULL(v)) {
            printf("%05zu\tNULL\n", i);
            continue;
        }
        
        if (VALUE_ISA_UNDEFINED(v)) {
            printf("%05zu\tUNDEFINED\n", i);
            continue;
        }
        
        if (VALUE_ISA_BOOL(v)) {
            printf("%05zu\tBOOL: %d\n", i, (v.n == 0) ? 0 : 1);
            continue;
        }
        
        if (VALUE_ISA_INT(v)) {
            printf("%05zu\tINT: %" PRId64 "\n", i, (int64_t)v.n);
            continue;
        }
        
        if (VALUE_ISA_FLOAT(v)) {
            printf("%05zu\tFLOAT: %g\n", i, (double)v.f);
            continue;
        }
        
        if (VALUE_ISA_FUNCTION(v)) {
            gravity_function_t *vf = VALUE_AS_FUNCTION(v);
            printf("%05zu\tFUNC: %s\n", i, (vf->identifier) ? vf->identifier : "$anon");
            continue;
        }
        
        if (VALUE_ISA_CLASS(v)) {
            gravity_class_t *c = VALUE_AS_CLASS(v);
            printf("%05zu\tCLASS: %s\n", i, (c->identifier) ? c->identifier: "$anon");
            continue;
            
        }
        
        if (VALUE_ISA_STRING(v)) {
            printf("%05zu\tSTRING: %s\n", i, VALUE_AS_CSTRING(v));
            continue;
        }
        
        if (VALUE_ISA_LIST(v)) {
            gravity_list_t *value = VALUE_AS_LIST(v);
            size_t count = marray_size(value->array);
            printf("%05zu\tLIST: %zu items\n", i, count);
            continue;
            
        }
        
        if (VALUE_ISA_MAP(v)) {
            gravity_map_t *map = VALUE_AS_MAP(v);
            printf("%05zu\tMAP: %u items\n", i, gravity_hash_count(map->hash));
            continue;
        }
        
        // should never reach this point
        assert(0);
    }
}